

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void FTransformWHTRow_SSE2(int16_t *in,__m128i *out)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  __m128i alVar11;
  undefined1 auVar12 [16];
  undefined1 auVar4 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = *(ulong *)in;
  uVar2 = *(undefined8 *)(in + 0x10);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_2_ = (short)(uVar1 >> 0x30);
  auVar4._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar3._12_4_ = auVar4._12_4_;
  auVar3._8_2_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar12._10_6_ = auVar3._10_6_;
  auVar12._8_2_ = (short)(uVar1 >> 0x20);
  auVar12._0_8_ = uVar1;
  auVar5._8_8_ = auVar12._8_8_;
  auVar5._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar5._4_2_ = (short)(uVar1 >> 0x10);
  auVar5._0_2_ = (undefined2)uVar1;
  auVar5._2_2_ = (short)uVar2;
  uVar1 = *(ulong *)(in + 0x20);
  uVar2 = *(undefined8 *)(in + 0x30);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9._12_2_ = (short)(uVar1 >> 0x30);
  auVar9._14_2_ = (short)((ulong)uVar2 >> 0x30);
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._8_2_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8._10_2_ = (short)((ulong)uVar2 >> 0x20);
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._8_2_ = (short)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = (short)((ulong)uVar2 >> 0x10);
  auVar6._4_2_ = (short)(uVar1 >> 0x10);
  auVar6._0_2_ = (undefined2)uVar1;
  auVar6._2_2_ = (short)uVar2;
  auVar12 = paddsw(auVar5,auVar6);
  auVar5 = psubsw(auVar5,auVar6);
  auVar10._0_4_ = auVar12._0_4_;
  auVar10._4_4_ = auVar5._0_4_;
  auVar10._12_4_ = auVar10._0_4_;
  auVar10._8_4_ = auVar5._0_4_;
  alVar11 = (__m128i)pmaddwd(auVar10,_DAT_001ab350);
  *out = alVar11;
  return;
}

Assistant:

static void FTransformWHTRow_SSE2(const int16_t* WEBP_RESTRICT const in,
                                  __m128i* const out) {
  const __m128i kMult = _mm_set_epi16(-1, 1, -1, 1, 1, 1, 1, 1);
  const __m128i src0 = _mm_loadl_epi64((__m128i*)&in[0 * 16]);
  const __m128i src1 = _mm_loadl_epi64((__m128i*)&in[1 * 16]);
  const __m128i src2 = _mm_loadl_epi64((__m128i*)&in[2 * 16]);
  const __m128i src3 = _mm_loadl_epi64((__m128i*)&in[3 * 16]);
  const __m128i A01 = _mm_unpacklo_epi16(src0, src1);  // A0 A1 | ...
  const __m128i A23 = _mm_unpacklo_epi16(src2, src3);  // A2 A3 | ...
  const __m128i B0 = _mm_adds_epi16(A01, A23);    // a0 | a1 | ...
  const __m128i B1 = _mm_subs_epi16(A01, A23);    // a3 | a2 | ...
  const __m128i C0 = _mm_unpacklo_epi32(B0, B1);  // a0 | a1 | a3 | a2 | ...
  const __m128i C1 = _mm_unpacklo_epi32(B1, B0);  // a3 | a2 | a0 | a1 | ...
  const __m128i D = _mm_unpacklo_epi64(C0, C1);   // a0 a1 a3 a2 a3 a2 a0 a1
  *out = _mm_madd_epi16(D, kMult);
}